

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activation.cpp
# Opt level: O0

void __thiscall Activation::Set(Activation *this,size_t up_index,size_t right_index,Sexp *value)

{
  ContractFrameProtector CVar1;
  bool bVar2;
  size_type sVar3;
  reference ppSVar4;
  value_type local_68;
  ulong local_60;
  size_t i_1;
  size_t diff;
  size_t i;
  Activation *cursor;
  ContractFrameProtector local_30;
  ContractFrameProtector __contract_frame;
  Sexp *value_local;
  size_t right_index_local;
  size_t up_index_local;
  Activation *this_local;
  
  __contract_frame.protected_frame = (ContractFrame *)value;
  ContractFrameProtector::ContractFrameProtector(&local_30,"Set");
  ContractFrameProtector::AddContract(&local_30,NoGc);
  bVar2 = Sexp::IsActivation((Sexp *)__contract_frame.protected_frame);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!value->IsActivation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/activation.cpp"
                  ,0x42,"void Activation::Set(size_t, size_t, Sexp *)");
  }
  diff = 0;
  i = (size_t)this;
  while( true ) {
    if (up_index <= diff) {
      if (i == 0) {
        __assert_fail("cursor != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/activation.cpp"
                      ,0x4b,"void Activation::Set(size_t, size_t, Sexp *)");
      }
      sVar3 = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::size
                        ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)(i + 8));
      if (sVar3 <= right_index) {
        sVar3 = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::size
                          ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)(i + 8));
        i_1 = right_index - sVar3;
        for (local_60 = 0; local_60 <= i_1; local_60 = local_60 + 1) {
          local_68 = (value_type)0x0;
          std::vector<Sexp_*,_std::allocator<Sexp_*>_>::push_back
                    ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)(i + 8),&local_68);
        }
      }
      sVar3 = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::size
                        ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)(i + 8));
      CVar1 = __contract_frame;
      if (sVar3 <= right_index) {
        __assert_fail("right_index < cursor->slots.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/activation.cpp"
                      ,0x55,"void Activation::Set(size_t, size_t, Sexp *)");
      }
      ppSVar4 = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::operator[]
                          ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)(i + 8),right_index);
      *ppSVar4 = (value_type)CVar1.protected_frame;
      ContractFrameProtector::~ContractFrameProtector(&local_30);
      return;
    }
    if (i == 0) {
      __assert_fail("cursor != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/activation.cpp"
                    ,0x46,"void Activation::Set(size_t, size_t, Sexp *)");
    }
    bVar2 = Sexp::IsActivation(*(Sexp **)i);
    if (!bVar2) break;
    i = *(size_t *)(*(long *)i + 8);
    diff = diff + 1;
  }
  __assert_fail("cursor->parent->IsActivation()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/activation.cpp"
                ,0x47,"void Activation::Set(size_t, size_t, Sexp *)");
}

Assistant:

void Activation::Set(size_t up_index, size_t right_index, Sexp *value) {
  CONTRACT { FORBID_GC; }